

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O3

void __thiscall
asio::basic_streambuf<std::allocator<char>_>::reserve
          (basic_streambuf<std::allocator<char>_> *this,size_t n)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong __n;
  pointer pcVar5;
  length_error ex;
  length_error local_30 [16];
  
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = *(long *)&this->field_0x28 - (long)pcVar1;
  lVar4 = *(long *)&this->field_0x30 - (long)pcVar1;
  uVar2 = lVar4 - __n;
  if (uVar2 < n) {
    if (*(pointer *)&this->field_0x10 != pcVar1) {
      lVar3 = (long)*(pointer *)&this->field_0x10 - (long)pcVar1;
      __n = __n - lVar3;
      memmove(pcVar1,pcVar1 + lVar3,__n);
      uVar2 = lVar4 - __n;
    }
    if (uVar2 < n) {
      if ((this->max_size_ < n) || (this->max_size_ - n < __n)) {
        std::length_error::length_error(local_30,"asio::streambuf too long");
        detail::throw_exception<std::length_error>(local_30);
        std::length_error::~length_error(local_30);
      }
      else {
        lVar4 = __n + n;
        std::vector<char,_std::allocator<char>_>::resize
                  (&this->buffer_,n + __n + (ulong)(lVar4 == 0));
      }
    }
    pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = pcVar1 + __n;
    *(pointer *)&this->field_0x8 = pcVar1;
    *(pointer *)&this->field_0x10 = pcVar1;
    *(pointer *)&this->field_0x18 = pcVar5;
    *(pointer *)&this->field_0x28 = pcVar5;
    *(pointer *)&this->field_0x20 = pcVar5;
    *(pointer *)&this->field_0x30 = pcVar1 + lVar4;
  }
  return;
}

Assistant:

void reserve(std::size_t n)
  {
    // Get current stream positions as offsets.
    std::size_t gnext = gptr() - &buffer_[0];
    std::size_t pnext = pptr() - &buffer_[0];
    std::size_t pend = epptr() - &buffer_[0];

    // Check if there is already enough space in the put area.
    if (n <= pend - pnext)
    {
      return;
    }

    // Shift existing contents of get area to start of buffer.
    if (gnext > 0)
    {
      pnext -= gnext;
      std::memmove(&buffer_[0], &buffer_[0] + gnext, pnext);
    }

    // Ensure buffer is large enough to hold at least the specified size.
    if (n > pend - pnext)
    {
      if (n <= max_size_ && pnext <= max_size_ - n)
      {
        pend = pnext + n;
        buffer_.resize((std::max<std::size_t>)(pend, 1));
      }
      else
      {
        std::length_error ex("asio::streambuf too long");
        asio::detail::throw_exception(ex);
      }
    }

    // Update stream positions.
    setg(&buffer_[0], &buffer_[0], &buffer_[0] + pnext);
    setp(&buffer_[0] + pnext, &buffer_[0] + pend);
  }